

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonstats.cpp
# Opt level: O2

stat_t * simdjson_computestats(stat_t *__return_storage_ptr__,string_view *p)

{
  uint8_t *input;
  char cVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  ParsedJson pj;
  uint local_5c;
  ulong *local_50;
  
  build_parsed_json((string_view *)&pj,SUB81(p,0));
  bVar2 = (bool)ParsedJson::isValid();
  __return_storage_ptr__->valid = bVar2;
  if (bVar2 != false) {
    sVar4 = p->_M_len;
    input = (uint8_t *)p->_M_str;
    sVar3 = count_backslash(input,sVar4);
    __return_storage_ptr__->backslash_count = sVar3;
    sVar3 = count_nonasciibytes(input,sVar4);
    __return_storage_ptr__->nonasciibyte_count = sVar3;
    __return_storage_ptr__->byte_count = sVar4;
    __return_storage_ptr__->structural_indexes_count = (ulong)local_5c;
    if ((char)(*local_50 >> 0x38) != 'r') {
      __assert_fail("type == \'r\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gian99Santos[P]simdjson/tools/jsonstats.cpp"
                    ,0x45,"stat_t simdjson_computestats(const std::string_view &)");
    }
    sVar4 = 0;
    sVar3 = 0;
    sVar5 = 0;
    sVar7 = 0;
    sVar8 = 0;
    sVar9 = 0;
    sVar10 = 0;
    sVar11 = 0;
    for (uVar6 = 1; uVar6 < (*local_50 & 0xffffffffffffff); uVar6 = uVar6 + 1) {
      if (local_50[uVar6] >> 0x38 == 0x22) {
        sVar10 = sVar10 + 1;
      }
      else {
        cVar1 = (char)(local_50[uVar6] >> 0x38);
        if (cVar1 == '[') {
          sVar11 = sVar11 + 1;
        }
        else if (cVar1 == 'd') {
          sVar3 = sVar3 + 1;
LAB_001023db:
          uVar6 = uVar6 + 1;
        }
        else if (cVar1 == 'f') {
          sVar8 = sVar8 + 1;
        }
        else if (cVar1 == '{') {
          sVar9 = sVar9 + 1;
        }
        else if (cVar1 == 'n') {
          sVar5 = sVar5 + 1;
        }
        else if (cVar1 == 't') {
          sVar7 = sVar7 + 1;
        }
        else if (cVar1 == 'l') {
          sVar4 = sVar4 + 1;
          goto LAB_001023db;
        }
      }
    }
    __return_storage_ptr__->array_count = sVar11;
    __return_storage_ptr__->string_count = sVar10;
    __return_storage_ptr__->object_count = sVar9;
    __return_storage_ptr__->false_count = sVar8;
    __return_storage_ptr__->true_count = sVar7;
    __return_storage_ptr__->null_count = sVar5;
    __return_storage_ptr__->float_count = sVar3;
    __return_storage_ptr__->integer_count = sVar4;
  }
  ParsedJson::~ParsedJson(&pj);
  return __return_storage_ptr__;
}

Assistant:

stat_t simdjson_computestats(const std::string_view &p) {
  stat_t answer;
  ParsedJson pj = build_parsed_json(p);
  answer.valid = pj.isValid();
  if (!answer.valid) {
    return answer;
  }
  answer.backslash_count = count_backslash(reinterpret_cast<const uint8_t*>(p.data()), p.size());
  answer.nonasciibyte_count = count_nonasciibytes(reinterpret_cast<const uint8_t*>(p.data()), p.size());
  answer.byte_count = p.size();
  answer.integer_count = 0;
  answer.float_count = 0;
  answer.object_count = 0;
  answer.array_count = 0;
  answer.null_count = 0;
  answer.true_count = 0;
  answer.false_count = 0;
  answer.string_count = 0;
  answer.structural_indexes_count = pj.n_structural_indexes;
  size_t tapeidx = 0;
  uint64_t tape_val = pj.tape[tapeidx++];
  uint8_t type = (tape_val >> 56);
  size_t howmany = 0;
  assert(type == 'r');
  howmany = tape_val & JSONVALUEMASK;
  for (; tapeidx < howmany; tapeidx++) {
    tape_val = pj.tape[tapeidx];
    // uint64_t payload = tape_val & JSONVALUEMASK;
    type = (tape_val >> 56);
    switch (type) {
    case 'l': // we have a long int
      answer.integer_count++;
      tapeidx++; // skipping the integer
      break;
    case 'd': // we have a double
      answer.float_count++;
      tapeidx++; // skipping the double
      break;
    case 'n': // we have a null
      answer.null_count++;
      break;
    case 't': // we have a true
      answer.true_count++;
      break;
    case 'f': // we have a false
      answer.false_count++;
      break;
    case '{': // we have an object
      answer.object_count++;
      break;
    case '}': // we end an object
      break;
    case '[': // we start an array
      answer.array_count++;
      break;
    case ']': // we end an array
      break;
    case '"': // we have a string
      answer.string_count++;
      break;
    default:
      break; // ignore
    }
  }
  return answer;
}